

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragIntRange2
               (char *label,int *v_current_min,int *v_current_max,float v_speed,int v_min,int v_max,
               char *format,char *format_max)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  int in_ECX;
  int *in_RDX;
  int *in_RSI;
  char *in_RDI;
  int in_R8D;
  int *in_R9;
  int *in_stack_00000008;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *in_stack_00000090;
  int in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  bool local_1;
  
  pIVar2 = GetCurrentWindow();
  if ((pIVar2->SkipItems & 1U) == 0) {
    PushID((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    BeginGroup();
    PushMultiItemsWidths(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    if (in_ECX < in_R8D) {
      ImMin<int>(in_R8D,*in_RDX);
    }
    local_1 = DragInt((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78,(float)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                      (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(char *)0x166978);
    PopItemWidth();
    SameLine((float)((ulong)in_stack_ffffffffffffff70 >> 0x20),(float)in_stack_ffffffffffffff70);
    if (in_ECX < in_R8D) {
      ImMax<int>(in_ECX,*in_RSI);
    }
    else {
      in_R8D = 0x7fffffff;
    }
    if (in_stack_00000008 != (int *)0x0) {
      in_R9 = in_stack_00000008;
    }
    bVar1 = DragInt((char *)CONCAT44(in_R8D,in_R8D),in_R9,
                    (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70
                    ,in_stack_ffffffffffffff6c,(char *)0x166a54);
    local_1 = local_1 || bVar1;
    PopItemWidth();
    SameLine((float)((ulong)in_stack_ffffffffffffff70 >> 0x20),(float)in_stack_ffffffffffffff70);
    FindRenderedTextEnd(in_RDI,(char *)0x0);
    TextUnformatted(in_stack_00000090,label);
    EndGroup();
    PopID();
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragIntRange2(const char* label, int* v_current_min, int* v_current_max, float v_speed, int v_min, int v_max, const char* format, const char* format_max)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2);

    bool value_changed = DragInt("##min", v_current_min, v_speed, (v_min >= v_max) ? INT_MIN : v_min, (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max), format);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);
    value_changed |= DragInt("##max", v_current_max, v_speed, (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min), (v_min >= v_max) ? INT_MAX : v_max, format_max ? format_max : format);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}